

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::operator+(String *__return_storage_ptr__,String *lhs,String *rhs)

{
  EVP_PKEY_CTX *src;
  String local_30;
  
  String::copy(&local_30,(EVP_PKEY_CTX *)lhs,(EVP_PKEY_CTX *)rhs);
  String::operator+=(&local_30,rhs);
  String::copy(__return_storage_ptr__,(EVP_PKEY_CTX *)&local_30,src);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String operator+(const String& lhs, const String& rhs) { return  String(lhs) += rhs; }